

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O3

Bytes * __thiscall
SSM::ECUPort::readECUPacket(Bytes *__return_storage_ptr__,ECUPort *this,bool echo)

{
  byte *pbVar1;
  const_iterator __begin1;
  value_type *__val;
  Byte csum;
  Bytes *body;
  Bytes local_78;
  Bytes *local_60;
  byte *local_58;
  
  local_60 = __return_storage_ptr__;
  pbVar1 = (byte *)operator_new(4);
  pbVar1[0] = 0;
  pbVar1[1] = 0;
  pbVar1[2] = 0;
  pbVar1[3] = 0;
  local_58 = pbVar1 + 4;
  do {
    readBytes(&local_78,this,1);
    *pbVar1 = *local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    operator_delete(local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_start);
  } while( true );
}

Assistant:

Bytes ECUPort::readECUPacket(bool echo) const
  {
    // Skip until we receive next complete package
    // Expected header of packet: -header byte,
    //                            -destination byte
    //                            -source byte
    //                            -datasize byte
    Bytes header(4);
    Byte SRC(ECU),DEST(TOOL);
    if(echo) std::swap(SRC, DEST);
    while(true)
      {
	header[0] = readBytes(1)[0];
	if (header[0] != HEADER) continue;

	header[1] = readBytes(1)[0];
	if (header[1] != DEST) continue;

	header[2] = readBytes(1)[0];
	if (header[2] != SRC) continue;

	header[3] = readBytes(1)[0];
	break;
      }

    // Now that dsize is known read response body and checksum
    uint8_t dsize = std::to_integer<uint8_t>(header.back());
    Bytes body = readBytes(dsize); Byte csum = readBytes(1)[0];

    // Validate checksum
    body.insert(body.begin(), header.begin(), header.end());
    if(csum != checksum(body))
      throw(InvalidChecksum("Checksum validation failed"));

    // Add the checksum and return
    body.push_back(csum);
    return body;
  }